

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O0

void __thiscall
ImportSource_hasImportSourceDifferentImportSources_Test::
~ImportSource_hasImportSourceDifferentImportSources_Test
          (ImportSource_hasImportSourceDifferentImportSources_Test *this)

{
  ImportSource_hasImportSourceDifferentImportSources_Test *this_local;
  
  ~ImportSource_hasImportSourceDifferentImportSources_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportSource, hasImportSourceDifferentImportSources)
{
    auto importer = libcellml::Importer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("some_url");
    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("some_other_url");

    EXPECT_FALSE(importer->hasImportSource(importSource1));
    EXPECT_FALSE(importer->hasImportSource(importSource2));

    importer->addImportSource(importSource1);

    EXPECT_TRUE(importer->hasImportSource(importSource1));
    EXPECT_FALSE(importer->hasImportSource(importSource2));
}